

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O2

void __thiscall leveldb::TableCache::~TableCache(TableCache *this)

{
  if (this->cache_ != (Cache *)0x0) {
    (*this->cache_->_vptr_Cache[1])();
  }
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

TableCache::~TableCache() { delete cache_; }